

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

treeNode * stmtSequence(void)

{
  int iVar1;
  treeNode *ptVar2;
  treeNode *ptVar3;
  treeNode *ptVar4;
  treeNode *ptVar5;
  string local_50;
  
  if (nextToken.kind == Eof) {
    ptVar3 = (treeNode *)0x0;
  }
  else {
    ptVar4 = (treeNode *)0x0;
    ptVar5 = (treeNode *)0x0;
    do {
      iVar1 = std::__cxx11::string::compare((char *)&nextToken.text);
      if (iVar1 == 0) {
        return ptVar5;
      }
      ptVar2 = statement();
      ptVar3 = ptVar5;
      if (ptVar2 != (treeNode *)0x0) {
        ptVar3 = ptVar2;
        if (ptVar4 != (treeNode *)0x0) {
          ptVar4->sibling = ptVar2;
          ptVar3 = ptVar5;
        }
        ptVar4 = ptVar2;
        if (((ptVar2->kind).stmtKind - assignStmt < 6) || ((ptVar2->kind).stmtKind == doRpt)) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,";","");
          match(&local_50,lackSem);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
      }
      ptVar5 = ptVar3;
    } while (nextToken.kind != Eof);
  }
  return ptVar3;
}

Assistant:

treeNode* stmtSequence()
{
    treeNode* ret=nullptr;
    treeNode* p=nullptr;
    treeNode* pre=nullptr;
    while(nextToken.kind!=Token::Eof&&nextToken.text!="}")
    {
        p=statement();
        if(p!=nullptr)
        {
            if(pre!=nullptr)pre->sibling=p;else ret=p;
            pre=p;
            switch(pre->kind.stmtKind)
            {
                case StmtKind::assignStmt:
                case StmtKind::breakStmt:
                case StmtKind::continueStmt:
                case StmtKind::doRpt:
                case StmtKind::printStmt:
                case StmtKind::readStmt:
                case StmtKind::declareStmt:
                    match(";",Error::lackSem);
                    break;
            }
        }
    }
    //match(";",Error::lackSem);
    return ret;
}